

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSeqSweep2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  uint local_ec;
  Ssw_Pars_t Pars;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  Ssw_ManSetDefaultParams(&Pars);
  local_ec = 0;
  Extra_UtilGetoptReset();
LAB_0023691d:
  iVar1 = Extra_UtilGetopt(argc,argv,"PQFCLSIVMNcmplkodsefqvwh");
  iVar5 = globalUtilOptind;
  switch(iVar1) {
  case 0x43:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nBTLimit = iVar1;
LAB_00236a39:
      globalUtilOptind = iVar5 + 1;
      if (iVar1 < 1) goto switchD_0023693d_caseD_44;
      goto LAB_0023691d;
    }
    pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
    break;
  case 0x44:
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4f:
  case 0x52:
  case 0x54:
  case 0x55:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6e:
  case 0x72:
  case 0x74:
  case 0x75:
    goto switchD_0023693d_caseD_44;
  case 0x46:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFramesK = iVar1;
      goto LAB_00236a39;
    }
    pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x49:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.nItersStop = uVar2;
LAB_00236ae1:
      globalUtilOptind = iVar5 + 1;
      if ((int)uVar2 < 0) goto switchD_0023693d_caseD_44;
      goto LAB_0023691d;
    }
    pcVar6 = "Command line switch \"-I\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nMaxLevs = iVar1;
      goto LAB_00236a39;
    }
    pcVar6 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.nRecycleCalls2 = uVar2;
      goto LAB_00236ae1;
    }
    pcVar6 = "Command line switch \"-M\" should be followed by an integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_ec = uVar2;
      goto LAB_00236ae1;
    }
    pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-P\" should be followed by an integer.\n";
      break;
    }
    Pars.nPartSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if (Pars.nPartSize < 2) {
switchD_0023693d_caseD_44:
      iVar5 = -2;
      Abc_Print(-2,"usage: scorr [-PQFCLSIVMN <num>] [-cmplkodsefqvwh]\n");
      Abc_Print(-2,"\t         performs sequential sweep using K-step induction\n");
      Abc_Print(-2,"\t-P num : max partition size (0 = no partitioning) [default = %d]\n",
                (ulong)(uint)Pars.nPartSize);
      Abc_Print(-2,"\t-Q num : partition overlap (0 = no overlap) [default = %d]\n",
                (ulong)(uint)Pars.nOverSize);
      Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
                (ulong)(uint)Pars.nFramesK);
      Abc_Print(-2,"\t-C num : max number of conflicts at a node (0=inifinite) [default = %d]\n",
                (ulong)(uint)Pars.nBTLimit);
      Abc_Print(-2,"\t-L num : max number of levels to consider (0=all) [default = %d]\n",
                (ulong)(uint)Pars.nMaxLevs);
      Abc_Print(-2,"\t-N num : number of last POs treated as constraints (0=none) [default = %d]\n",
                (ulong)(uint)Pars.fConstrs);
      Abc_Print(-2,
                "\t-S num : additional simulation frames for c-examples (0=none) [default = %d]\n",
                (ulong)(uint)Pars.nFramesAddSim);
      Abc_Print(-2,
                "\t-I num : iteration number to stop and output SR-model (-1=none) [default = %d]\n"
                ,(ulong)(uint)Pars.nItersStop);
      Abc_Print(-2,"\t-V num : min var num needed to recycle the SAT solver [default = %d]\n",
                (ulong)(uint)Pars.nSatVarMax2);
      Abc_Print(-2,"\t-M num : min call num needed to recycle the SAT solver [default = %d]\n",
                (ulong)(uint)Pars.nRecycleCalls2);
      Abc_Print(-2,"\t-N num : set last <num> POs to be constraints (use with -c) [default = %d]\n",
                (ulong)local_ec);
      pcVar4 = "yes";
      pcVar6 = "yes";
      if (Pars.fConstrs == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using explicit constraints [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fMergeFull == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle full merge if constraints are present [default = %s]\n",pcVar6
               );
      pcVar6 = "yes";
      if (Pars.fPolarFlip == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle aligning polarity of SAT variables [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fLatchCorr == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle doing latch correspondence [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fConstCorr == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-k     : toggle doing constant correspondence [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fOutputCorr == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-o     : toggle doing \'PO correspondence\' [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fDynamic == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle dynamic addition of constraints [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fLocalSim == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle local simulation in the cone of influence [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (Pars.fEquivDump == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle dumping disproved internal equivalences [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (Pars.fEquivDump2 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle dumping proved internal equivalences [default = %s]\n",pcVar6)
      ;
      pcVar6 = "yes";
      if (Pars.fStopWhenGone == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-q     : toggle quitting when PO is not a constant candidate [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (Pars.fFlopVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printout of flop equivalences [default = %s]\n",pcVar6);
      if (Pars.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
      pcVar6 = "\t-h     : print the command usage\n";
LAB_00236e7b:
      Abc_Print(iVar5,pcVar6);
      return 1;
    }
    goto LAB_0023691d;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.nOverSize = uVar2;
      goto LAB_00236ae1;
    }
    pcVar6 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.nFramesAddSim = uVar2;
      goto LAB_00236ae1;
    }
    pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x56:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.nSatVarMax2 = uVar2;
      goto LAB_00236ae1;
    }
    pcVar6 = "Command line switch \"-V\" should be followed by an integer.\n";
    break;
  case 99:
    Pars.fConstrs = Pars.fConstrs ^ 1;
    goto LAB_0023691d;
  case 100:
    Pars.fDynamic = Pars.fDynamic ^ 1;
    goto LAB_0023691d;
  case 0x65:
    Pars.fEquivDump = Pars.fEquivDump ^ 1;
    goto LAB_0023691d;
  case 0x66:
    Pars.fEquivDump2 = Pars.fEquivDump2 ^ 1;
    goto LAB_0023691d;
  case 0x6b:
    Pars.fConstCorr = Pars.fConstCorr ^ 1;
    goto LAB_0023691d;
  case 0x6c:
    Pars.fLatchCorr = Pars.fLatchCorr ^ 1;
    goto LAB_0023691d;
  case 0x6d:
    Pars.fMergeFull = Pars.fMergeFull ^ 1;
    goto LAB_0023691d;
  case 0x6f:
    Pars.fOutputCorr = Pars.fOutputCorr ^ 1;
    goto LAB_0023691d;
  case 0x70:
    Pars.fPolarFlip = Pars.fPolarFlip ^ 1;
    goto LAB_0023691d;
  case 0x71:
    Pars.fStopWhenGone = Pars.fStopWhenGone ^ 1;
    goto LAB_0023691d;
  case 0x73:
    Pars.fLocalSim = Pars.fLocalSim ^ 1;
    goto LAB_0023691d;
  case 0x76:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_0023691d;
  case 0x77:
    Pars.fFlopVerbose = Pars.fFlopVerbose ^ 1;
    goto LAB_0023691d;
  default:
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        pcVar6 = "Empty network.\n";
      }
      else {
        if (pAVar3->nObjCounts[8] == 0) {
          pcVar6 = "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n";
LAB_00236f4c:
          Abc_Print(0,pcVar6);
          return 0;
        }
        if (pAVar3->ntkType != ABC_NTK_STRASH) {
          pcVar6 = "This command works only for structrally hashed networks. Run \"st\".\n";
          goto LAB_00236f4c;
        }
        if (pAVar3->vPis->nSize == 0) {
          pcVar6 = "This command works only for designs with primary inputs.\n";
          goto LAB_00236f4c;
        }
        if (local_ec != 0) {
          if (0 < pAVar3->nConstrs) {
            Abc_Print(-1,"The network already has %d constraints.\n");
            return 0;
          }
          Abc_Print(0,"Setting the number of constraints to be %d.\n",(ulong)local_ec);
          pAVar3->nConstrs = local_ec;
        }
        if (Pars.fConstrs != 0) {
          if (pAVar3->nConstrs == pAVar3->vPos->nSize) {
            pcVar6 = 
            "Command cannot be applied because the network has only constraint outputs (no primary outputs).\n"
            ;
            goto LAB_00236f4c;
          }
          if (pAVar3->nConstrs < 1) {
            Abc_Print(0,"Performing constraint-based scorr without constraints.\n");
            Pars.fConstrs = 0;
          }
          else {
            Abc_Print(0,"Performing scorr with %d constraints.\n");
          }
        }
        if ((Pars.fEquivDump != 0) && (Pars.fEquivDump2 != 0)) {
          pcVar6 = "Command line switches \'-e\' and \'-f\' cannot be used at the same time.\n";
          goto LAB_00236f4c;
        }
        pAVar3 = Abc_NtkDarSeqSweep2(pAVar3,&Pars);
        if (pAVar3 != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
          return 0;
        }
        pcVar6 = "Sequential sweeping has failed.\n";
      }
      iVar5 = -1;
      goto LAB_00236e7b;
    }
    goto switchD_0023693d_caseD_44;
  }
  Abc_Print(-1,pcVar6);
  goto switchD_0023693d_caseD_44;
}

Assistant:

int Abc_CommandSeqSweep2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Ssw_Pars_t Pars, * pPars = &Pars;
    int nConstrs = 0;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarSeqSweep2( Abc_Ntk_t * pNtk, Ssw_Pars_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Ssw_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PQFCLSIVMNcmplkodsefqvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPartSize < 2 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOverSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOverSize < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK <= 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit <= 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxLevs <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesAddSim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesAddSim < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nItersStop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nItersStop < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax2 < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRecycleCalls2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRecycleCalls2 < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nConstrs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConstrs < 0 )
                goto usage;
            break;
        case 'c':
            pPars->fConstrs ^= 1;
            break;
        case 'm':
            pPars->fMergeFull ^= 1;
            break;
        case 'p':
            pPars->fPolarFlip ^= 1;
            break;
        case 'l':
            pPars->fLatchCorr ^= 1;
            break;
        case 'k':
            pPars->fConstCorr ^= 1;
            break;
        case 'o':
            pPars->fOutputCorr ^= 1;
            break;
//        case 'f':
//            pPars->fSemiFormal ^= 1;
//            break;
        case 'd':
            pPars->fDynamic ^= 1;
            break;
        case 's':
            pPars->fLocalSim ^= 1;
            break;
        case 'e':
            pPars->fEquivDump ^= 1;
            break;
        case 'f':
            pPars->fEquivDump2 ^= 1;
            break;
        case 'q':
            pPars->fStopWhenGone ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fFlopVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 0, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    if ( Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "This command works only for designs with primary inputs.\n" );
        return 0;
    }

    // if constraints are to be used, network should have no constraints
    if ( nConstrs > 0 )
    {
        if ( Abc_NtkConstrNum(pNtk) > 0 )
        {
            Abc_Print( -1, "The network already has %d constraints.\n", Abc_NtkConstrNum(pNtk) );
            return 0;
        }
        else
        {
            Abc_Print( 0, "Setting the number of constraints to be %d.\n", nConstrs );
            pNtk->nConstrs = nConstrs;
        }
    }

    if ( pPars->fConstrs )
    {
        if ( Abc_NtkConstrNum(pNtk) == Abc_NtkPoNum(pNtk) )
        {
            Abc_Print( 0, "Command cannot be applied because the network has only constraint outputs (no primary outputs).\n" );
            return 0;
        }
        if ( Abc_NtkConstrNum(pNtk) > 0 )
            Abc_Print( 0, "Performing scorr with %d constraints.\n", Abc_NtkConstrNum(pNtk) );
        else
        {
            Abc_Print( 0, "Performing constraint-based scorr without constraints.\n" );
            pPars->fConstrs = 0;
        }
    }
    if ( pPars->fEquivDump && pPars->fEquivDump2 )
    {
        Abc_Print( 0, "Command line switches \'-e\' and \'-f\' cannot be used at the same time.\n" );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkDarSeqSweep2( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: scorr [-PQFCLSIVMN <num>] [-cmplkodsefqvwh]\n" );
    Abc_Print( -2, "\t         performs sequential sweep using K-step induction\n" );
    Abc_Print( -2, "\t-P num : max partition size (0 = no partitioning) [default = %d]\n", pPars->nPartSize );
    Abc_Print( -2, "\t-Q num : partition overlap (0 = no overlap) [default = %d]\n", pPars->nOverSize );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-C num : max number of conflicts at a node (0=inifinite) [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-L num : max number of levels to consider (0=all) [default = %d]\n", pPars->nMaxLevs );
    Abc_Print( -2, "\t-N num : number of last POs treated as constraints (0=none) [default = %d]\n", pPars->fConstrs );
    Abc_Print( -2, "\t-S num : additional simulation frames for c-examples (0=none) [default = %d]\n", pPars->nFramesAddSim );
    Abc_Print( -2, "\t-I num : iteration number to stop and output SR-model (-1=none) [default = %d]\n", pPars->nItersStop );
    Abc_Print( -2, "\t-V num : min var num needed to recycle the SAT solver [default = %d]\n", pPars->nSatVarMax2 );
    Abc_Print( -2, "\t-M num : min call num needed to recycle the SAT solver [default = %d]\n", pPars->nRecycleCalls2 );
    Abc_Print( -2, "\t-N num : set last <num> POs to be constraints (use with -c) [default = %d]\n", nConstrs );
    Abc_Print( -2, "\t-c     : toggle using explicit constraints [default = %s]\n", pPars->fConstrs? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle full merge if constraints are present [default = %s]\n", pPars->fMergeFull? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle aligning polarity of SAT variables [default = %s]\n", pPars->fPolarFlip? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle doing latch correspondence [default = %s]\n", pPars->fLatchCorr? "yes": "no" );
    Abc_Print( -2, "\t-k     : toggle doing constant correspondence [default = %s]\n", pPars->fConstCorr? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle doing \'PO correspondence\' [default = %s]\n", pPars->fOutputCorr? "yes": "no" );
//    Abc_Print( -2, "\t-f     : toggle filtering using iterative BMC [default = %s]\n", pPars->fSemiFormal? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dynamic addition of constraints [default = %s]\n", pPars->fDynamic? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle local simulation in the cone of influence [default = %s]\n", pPars->fLocalSim? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle dumping disproved internal equivalences [default = %s]\n", pPars->fEquivDump? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle dumping proved internal equivalences [default = %s]\n", pPars->fEquivDump2? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle quitting when PO is not a constant candidate [default = %s]\n", pPars->fStopWhenGone? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printout of flop equivalences [default = %s]\n", pPars->fFlopVerbose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}